

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::StoreProperty<char_const*>(cmTarget *this,string *prop,char *value)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  char *pcVar4;
  __type _Var5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  cmGlobalGenerator *pcVar9;
  size_t sVar10;
  cmValue cVar11;
  mapped_type *this_00;
  cmake *pcVar12;
  cmTarget *this_01;
  string *psVar13;
  undefined1 in_R9B;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string reusedFrom;
  ostringstream e;
  char *local_260;
  string local_258;
  string local_238;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [80];
  ios_base local_1a8 [264];
  cmListFileBacktrace local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sVar10 = prop->_M_string_length;
  local_260 = value;
  if ((sVar10 == DAT_008e00e8) &&
     ((sVar10 == 0 ||
      (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                    (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,sVar10),
      iVar7 == 0)))) {
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n","");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  else if ((sVar10 == DAT_008e0108) &&
          ((sVar10 == 0 ||
           (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propNAME_abi_cxx11_,sVar10)
           , iVar7 == 0)))) {
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"NAME property is read-only\n","");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  else {
    if ((sVar10 != DAT_008e0148) ||
       ((sVar10 != 0 &&
        (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propTYPE_abi_cxx11_,sVar10),
        iVar7 != 0)))) {
      if ((sVar10 == DAT_008e0008) &&
         (((sVar10 == 0 ||
           (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propEXPORT_NAME_abi_cxx11_,
                         sVar10), iVar7 == 0)) &&
          (((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
           true)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"EXPORT_NAME property can\'t be set on imported targets (\""
                   ,0x38);
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
        pcVar2 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
LAB_0028968b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_002896a6;
        local_238.field_2._M_allocated_capacity =
             CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                      local_258.field_2._M_local_buf[0]);
        local_238._M_dataplus._M_p = local_258._M_dataplus._M_p;
      }
      else {
        if (((sVar10 == DAT_008e0128) &&
            ((sVar10 == 0 ||
             (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propSOURCES_abi_cxx11_,
                           sVar10), iVar7 == 0)))) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"SOURCES property can\'t be set on imported targets (\"",
                     0x34);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028968b;
        }
        if (((sVar10 == DAT_008e0048) &&
            ((sVar10 == 0 ||
             (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                           (anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_,sVar10), iVar7 == 0
             )))) && (((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IsImportedTarget == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\"",0x40);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028968b;
        }
        if ((sVar10 == DAT_008e0068) &&
           ((sVar10 == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_,sVar10),
            iVar7 == 0)))) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->IncludeDirectoriesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->IncludeDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,&local_260,(cmListFileBacktrace *)local_218);
LAB_002899d5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          return;
        }
        if ((sVar10 == DAT_008dff88) &&
           ((sVar10 == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_,sVar10), iVar7 == 0)
            ))) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileOptionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileOptionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileFeaturesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileFeaturesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileFeaturesEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileDefinitionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileDefinitionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileDefinitionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkOptionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkOptionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkOptionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkDirectoriesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkDirectoriesEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->PrecompileHeadersEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->PrecompileHeadersEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      PrecompileHeadersEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkImplementationPropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkImplementationPropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkImplementationPropertyEntries,&local_260,(cmListFileBacktrace *)local_218)
          ;
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfacePropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfacePropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfacePropertyEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfaceDirectPropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfaceDirectPropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectPropertyEntries,&local_260,(cmListFileBacktrace *)local_218
                    );
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectExcludePropertyEntries,&local_260,
                     (cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propSOURCES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->SourceEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->SourceEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260 == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      SourceEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_002899d5;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
        if (_Var5) {
          bVar6 = cmValue::IsOn(local_260);
          if (bVar6) {
            _Var1._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if ((_Var1._M_head_impl)->ImportedGloballyVisible != false) {
              return;
            }
            (_Var1._M_head_impl)->ImportedGloballyVisible = true;
            pcVar9 = cmMakefile::GetGlobalGenerator((_Var1._M_head_impl)->Makefile);
            cmGlobalGenerator::IndexTarget(pcVar9,this);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\"",0x3c);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028968b;
        }
        local_218._8_8_ = (prop->_M_dataplus)._M_p;
        local_218._0_8_ = prop->_M_string_length;
        bVar6 = false;
        __str._M_str = "IMPORTED_LIBNAME";
        __str._M_len = 0x10;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,0x10,
                           __str);
        pcVar4 = local_260;
        if (iVar7 == 0) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          if (local_260 == (char *)0x0) {
            local_258._M_string_length = 0;
            local_258.field_2._M_local_buf[0] = '\0';
          }
          else {
            sVar10 = strlen(local_260);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_258,pcVar4,pcVar4 + sVar10);
          }
          bVar6 = cmTargetInternals::CheckImportedLibName(_Var1._M_head_impl,prop,&local_258);
          bVar6 = !bVar6;
        }
        if ((iVar7 == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2)) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        if (bVar6) {
          return;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propCUDA_PTX_COMPILATION_abi_cxx11_)
        ;
        if ((_Var5) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\"",0x46)
          ;
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_238);
        }
        else {
          _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&(anonymous_namespace)::
                                           propPRECOMPILE_HEADERS_REUSE_FROM_abi_cxx11_);
          if (!_Var5) {
            _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
            if (((((!_Var5) &&
                  (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&(anonymous_namespace)::
                                                    propCXX_STANDARD_abi_cxx11_), !_Var5)) &&
                 (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&(anonymous_namespace)::
                                                   propCUDA_STANDARD_abi_cxx11_), !_Var5)) &&
                ((_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_
                                         ), !_Var5 &&
                 (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&(anonymous_namespace)::
                                                   propOBJC_STANDARD_abi_cxx11_), !_Var5)))) &&
               (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&(anonymous_namespace)::
                                                 propOBJCXX_STANDARD_abi_cxx11_), !_Var5)) {
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                                ((FileSetType *)&(_Var1._M_head_impl)->HeadersFileSets,this,
                                 _Var1._M_head_impl,prop,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                                ((FileSetType *)&(_Var1._M_head_impl)->CxxModulesFileSets,this,
                                 _Var1._M_head_impl,prop,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                                ((FileSetType *)&(_Var1._M_head_impl)->CxxModuleHeadersFileSets,this
                                 ,_Var1._M_head_impl,prop,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              cmPropertyMap::SetProperty
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Properties,prop,local_260);
              return;
            }
            if (local_260 == (char *)0x0) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::erase(&((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                       LanguageStandardProperties,prop);
              return;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,local_260,(allocator<char> *)&local_238);
            cmMakefile::GetBacktrace
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
            BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            BTs((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_218,&local_70,&local_a0);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&((this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    )->LanguageStandardProperties,prop);
            std::__cxx11::string::operator=((string *)this_00,(string *)local_218);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::_M_move_assign
                      (&this_00->Backtraces,local_1f8);
            BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BTs((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218);
            if (local_a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_238.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p == &local_70.field_2) {
              return;
            }
            goto LAB_00289505;
          }
          local_218._0_8_ = &local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,"PRECOMPILE_HEADERS","");
          cVar11 = GetProperty(this,(string *)local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ != &local_208) {
            operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
          }
          if (cVar11.Value == (string *)0x0) {
            pcVar12 = cmMakefile::GetCMakeInstance
                                (((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile);
            pcVar9 = (pcVar12->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_218,local_260,(allocator<char> *)&local_238);
            this_01 = cmGlobalGenerator::FindTarget(pcVar9,(string *)local_218,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
            }
            if (this_01 == (cmTarget *)0x0) {
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,
                         "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target","");
              cmMakefile::IssueMessage
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                         ,FATAL_ERROR,(string *)local_218);
              local_238.field_2._M_allocated_capacity = local_208._M_allocated_capacity;
              local_70._M_dataplus._M_p = (pointer)local_218._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ == &local_208) {
                return;
              }
            }
            else {
              psVar13 = GetSafeProperty(this_01,prop);
              pcVar3 = (psVar13->_M_dataplus)._M_p;
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_238,pcVar3,pcVar3 + psVar13->_M_string_length);
              if ((_func_int **)local_238._M_string_length == (_func_int **)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_218,local_260,(allocator<char> *)&local_90);
                std::__cxx11::string::operator=((string *)&local_238,(string *)local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
                }
              }
              cmPropertyMap::SetProperty
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Properties,prop,&local_238);
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              StoreProperty<cmValue>(this_01,(string *)local_218,&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
              }
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"COMPILE_PDB_OUTPUT_DIRECTORY","");
              local_218._0_8_ = local_238._M_string_length;
              local_218._8_8_ = local_238._M_dataplus._M_p;
              local_208._M_allocated_capacity = 5;
              local_208._8_8_ = (long)"/CMakeFiles/CMakeRelink.dir/" + 0x17;
              views._M_len = 2;
              views._M_array = (iterator)local_218;
              cmCatViews_abi_cxx11_(&local_50,views);
              StoreProperty<cmValue>(this_01,&local_90,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              cVar11 = GetProperty(this_01,(string *)local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
              }
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              StoreProperty<cmValue>(this,(string *)local_218,cVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
              }
              AddUtility(this,&local_238,false,
                         ((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              local_70._M_dataplus._M_p = local_238._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == &local_238.field_2) {
                return;
              }
            }
            goto LAB_00289505;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"PRECOMPILE_HEADERS property is already set on target (\""
                     ,0x37);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p == &local_238.field_2) goto LAB_002896a6;
      }
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
LAB_002896a6:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      std::ios_base::~ios_base(local_1a8);
      return;
    }
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"TYPE property is read-only\n","");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  local_238.field_2._M_allocated_capacity = local_208._M_allocated_capacity;
  local_70._M_dataplus._M_p = (pointer)local_218._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ == &local_208) {
    return;
  }
LAB_00289505:
  operator_delete(local_70._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmTarget::StoreProperty(const std::string& prop, ValueType value)
{
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    return;
  }
  if (prop == propNAME) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == propTYPE) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "TYPE property is read-only\n");
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->impl->IncludeDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->impl->CompileOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->impl->CompileFeaturesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->impl->CompileDefinitionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->impl->LinkOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->impl->LinkDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propPRECOMPILE_HEADERS) {
    this->impl->PrecompileHeadersEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->impl->LinkImplementationPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    this->impl->LinkInterfacePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    this->impl->LinkInterfaceDirectPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    this->impl->LinkInterfaceDirectExcludePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == propSOURCES) {
    this->impl->SourceEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->SourceEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmIsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->impl->ImportedGloballyVisible) {
      this->impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->impl->CheckImportedLibName(
               prop,
               value ? value
                     : std::string{})) { // NOLINT(bugprone-branch-clone)
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else if (prop == propPRECOMPILE_HEADERS_REUSE_FROM) {
    if (this->GetProperty("PRECOMPILE_HEADERS")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS property is already set on target (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    auto* reusedTarget = this->impl->Makefile->GetCMakeInstance()
                           ->GetGlobalGenerator()
                           ->FindTarget(value);
    if (!reusedTarget) {
      const std::string e(
        "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target");
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      return;
    }

    std::string reusedFrom = reusedTarget->GetSafeProperty(prop);
    if (reusedFrom.empty()) {
      reusedFrom = ConvertToString(value);
    }

    this->impl->Properties.SetProperty(prop, reusedFrom);

    reusedTarget->SetProperty("COMPILE_PDB_NAME", reusedFrom);
    reusedTarget->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              cmStrCat(reusedFrom, ".dir/"));

    cmValue tmp = reusedTarget->GetProperty("COMPILE_PDB_NAME");
    this->SetProperty("COMPILE_PDB_NAME", tmp);
    this->AddUtility(reusedFrom, false, this->impl->Makefile);
  } else if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
             prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
             prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
    if (value) {
      this->impl->LanguageStandardProperties[prop] =
        BTs<std::string>(value, this->impl->Makefile->GetBacktrace());
    } else {
      this->impl->LanguageStandardProperties.erase(prop);
    }
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.SetProperty(prop, value);
  }
}